

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::wheelEvent(Picker *this,QWheelEvent *event)

{
  bool bVar1;
  int iVar2;
  PickerPrivate *pPVar3;
  uint uVar4;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int __fd;
  QPoint local_28;
  QPoint numDegrees;
  QPoint numPixels;
  QWheelEvent *event_local;
  Picker *this_local;
  
  __fd = (int)event;
  numDegrees = QWheelEvent::pixelDelta(event);
  local_28 = QWheelEvent::angleDelta(event);
  bVar1 = QPoint::isNull(&numDegrees);
  if (bVar1) {
    bVar1 = QPoint::isNull(&local_28);
    __addr = extraout_RDX_00;
    if (!bVar1) {
      iVar2 = QPoint::y(&local_28);
      pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      uVar4 = iVar2 / 8 + pPVar3->drawItemOffset;
      in_RCX = (socklen_t *)(ulong)uVar4;
      pPVar3->drawItemOffset = uVar4;
      QWidget::update();
      __addr = extraout_RDX_01;
    }
  }
  else {
    iVar2 = QPoint::y(&numDegrees);
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    uVar4 = iVar2 + pPVar3->drawItemOffset;
    in_RCX = (socklen_t *)(ulong)uVar4;
    pPVar3->drawItemOffset = uVar4;
    QWidget::update();
    __addr = extraout_RDX;
  }
  QEvent::accept((QEvent *)event,__fd,__addr,in_RCX);
  return;
}

Assistant:

void
Picker::wheelEvent( QWheelEvent * event )
{
	QPoint numPixels = event->pixelDelta();
	QPoint numDegrees = event->angleDelta();

	if( !numPixels.isNull() )
	{
		d->drawItemOffset += numPixels.y();
		update();
	}
	else if( !numDegrees.isNull() )
	{
		d->drawItemOffset += numDegrees.y() / 8;
		update();
	}

	event->accept();
}